

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O3

void perform_one_test_safe
               (FILE *fp,int argc,char **argv,png_uint_32 *default_flags,display *d,char *test)

{
  int iVar1;
  
  iVar1 = _setjmp((__jmp_buf_tag *)d);
  if (iVar1 == 0) {
    d->test = test;
    perform_one_test(fp,argc,argv,default_flags,d,0);
    perform_one_test(fp,argc,argv,default_flags,d,1);
    d->test = "initialization";
  }
  return;
}

Assistant:

static void
perform_one_test_safe(FILE *fp, int argc, const char **argv,
   png_uint_32 *default_flags, display *d, const char *test)
{
   if (setjmp(d->error_return) == 0)
   {
      d->test = test; /* allow use of d->error_return */
#     ifdef PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED
         perform_one_test(fp, argc, argv, default_flags, d, 0);
#     endif
#     ifdef PNG_READ_USER_CHUNKS_SUPPORTED
         perform_one_test(fp, argc, argv, default_flags, d, 1);
#     endif
      d->test = init; /* prevent use of d->error_return */
   }
}